

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O2

void __thiscall
GlobalSimpleStringMemoryAccountant::restoreAllocator(GlobalSimpleStringMemoryAccountant *this)

{
  AccountingTestMemoryAllocator *pAVar1;
  
  if (this->allocator_ != (AccountingTestMemoryAllocator *)0x0) {
    pAVar1 = (AccountingTestMemoryAllocator *)SimpleString::getStringAllocator();
    if (pAVar1 == this->allocator_) {
      SimpleString::stringAllocator_ =
           AccountingTestMemoryAllocator::originalAllocator(this->allocator_);
    }
  }
  return;
}

Assistant:

void GlobalSimpleStringMemoryAccountant::restoreAllocator()
{
    if (allocator_ && (SimpleString::getStringAllocator() == allocator_))
        SimpleString::setStringAllocator(allocator_->originalAllocator());
}